

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13acd4::EqualizerState::deviceUpdate(EqualizerState *this,ALCdevice *param_2)

{
  _Mem_fn<void_(BiquadFilterR<float>::*)()> __f;
  BiquadFilterR<float> *__first;
  BiquadFilterR<float> *__pm;
  long in_RDI;
  anon_struct_240_3_8d696fa7 *e;
  anon_struct_240_3_8d696fa7 *__end1;
  anon_struct_240_3_8d696fa7 *__begin1;
  anon_struct_240_3_8d696fa7 (*__range1) [16];
  BiquadFilterR<float> *in_stack_ffffffffffffff78;
  float *local_20;
  
  for (local_20 = (float *)(in_RDI + 0x20);
      (BiquadFilterR<float> (*) [4])local_20 != (BiquadFilterR<float> (*) [4])(in_RDI + 0xf20);
      local_20 = local_20 + 0x3c) {
    __first = std::begin<BiquadFilterR<float>,4ul>((BiquadFilterR<float> (*) [4])local_20);
    __pm = std::end<BiquadFilterR<float>,4ul>((BiquadFilterR<float> (*) [4])local_20);
    std::mem_fn<void(),BiquadFilterR<float>>((offset_in_BiquadFilterR<float>_to_subr)__pm);
    __f.super__Mem_fn_base<void_(BiquadFilterR<float>::*)(),_true>._8_8_ = __pm;
    __f.super__Mem_fn_base<void_(BiquadFilterR<float>::*)(),_true>._M_pmf =
         (offset_in_BiquadFilterR<float>_to_subr)__first;
    std::for_each<BiquadFilterR<float>*,std::_Mem_fn<void(BiquadFilterR<float>::*)()>>
              (in_stack_ffffffffffffff78,(BiquadFilterR<float> *)0x1d891e,__f);
    std::begin<float,16ul>((float (*) [16])(local_20 + 0x1c));
    std::end<float,16ul>((float (*) [16])(local_20 + 0x1c));
    std::fill<float*,float>(&__first->mZ1,&in_stack_ffffffffffffff78->mZ1,(float *)0x1d8964);
  }
  return;
}

Assistant:

void EqualizerState::deviceUpdate(const ALCdevice*)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.filter), std::end(e.filter), std::mem_fn(&BiquadFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}